

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O2

int __thiscall
diy::AMRLink::clone(AMRLink *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  AMRLink *this_00;
  
  this_00 = (AMRLink *)operator_new(0x1a0);
  AMRLink(this_00,this);
  return (int)this_00;
}

Assistant:

Link*         clone() const override                  { return new AMRLink(*this); }